

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_application.h
# Opt level: O3

void __thiscall MessageCracker::process(MessageCracker *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  iterator iVar2;
  ClOrdID clOrdID;
  PossResend possResend;
  pair<FIX::ClOrdID,_FIX::SessionID> pair;
  Message echo;
  FieldBase local_3f8;
  FieldBase local_398;
  pair<FIX::ClOrdID,_FIX::SessionID> local_338;
  Message local_170 [344];
  
  FIX::Message::Message(local_170,message);
  FIX::BoolField::BoolField((BoolField *)&local_398,0x61,false);
  local_398._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015f890;
  FIX::FieldMap::getFieldIfSet((FieldMap *)(message + 0x70),&local_398);
  FIX::StringField::StringField((StringField *)&local_3f8,0xb);
  local_3f8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015f900;
  FIX::FieldMap::getField((FieldMap *)message,&local_3f8);
  std::pair<FIX::ClOrdID,_FIX::SessionID>::pair<FIX::ClOrdID_&,_true>
            (&local_338,(ClOrdID *)&local_3f8,sessionID);
  bVar1 = FIX::BoolField::getValue((BoolField *)&local_398);
  if (bVar1) {
    iVar2 = std::
            _Rb_tree<std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::_Identity<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::less<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::allocator<std::pair<FIX::ClOrdID,_FIX::SessionID>_>_>
            ::find(&(this->m_orderIDs)._M_t,&local_338);
    if ((_Rb_tree_header *)iVar2._M_node != &(this->m_orderIDs)._M_t._M_impl.super__Rb_tree_header)
    goto LAB_00144b2e;
  }
  std::
  _Rb_tree<std::pair<FIX::ClOrdID,FIX::SessionID>,std::pair<FIX::ClOrdID,FIX::SessionID>,std::_Identity<std::pair<FIX::ClOrdID,FIX::SessionID>>,std::less<std::pair<FIX::ClOrdID,FIX::SessionID>>,std::allocator<std::pair<FIX::ClOrdID,FIX::SessionID>>>
  ::_M_insert_unique<std::pair<FIX::ClOrdID,FIX::SessionID>const&>
            ((_Rb_tree<std::pair<FIX::ClOrdID,FIX::SessionID>,std::pair<FIX::ClOrdID,FIX::SessionID>,std::_Identity<std::pair<FIX::ClOrdID,FIX::SessionID>>,std::less<std::pair<FIX::ClOrdID,FIX::SessionID>>,std::allocator<std::pair<FIX::ClOrdID,FIX::SessionID>>>
              *)&this->m_orderIDs,&local_338);
  FIX::Session::sendToTarget(local_170,sessionID);
LAB_00144b2e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338.second.m_frozenString._M_dataplus._M_p !=
      &local_338.second.m_frozenString.field_2) {
    operator_delete(local_338.second.m_frozenString._M_dataplus._M_p,
                    local_338.second.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338.second.m_sessionQualifier._M_dataplus._M_p !=
      &local_338.second.m_sessionQualifier.field_2) {
    operator_delete(local_338.second.m_sessionQualifier._M_dataplus._M_p,
                    local_338.second.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&local_338.second.m_targetCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&local_338.second.m_senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&local_338.second);
  FIX::FieldBase::~FieldBase((FieldBase *)&local_338);
  FIX::FieldBase::~FieldBase(&local_3f8);
  FIX::FieldBase::~FieldBase(&local_398);
  FIX::Message::~Message(local_170);
  return;
}

Assistant:

void process( const FIX::Message& message, const FIX::SessionID& sessionID )
  {
    FIX::Message echo = message;
    FIX::PossResend possResend( false );
    message.getHeader().getFieldIfSet( possResend );

    FIX::ClOrdID clOrdID;
    message.getField( clOrdID );

    std::pair < FIX::ClOrdID, FIX::SessionID > pair =
      std::make_pair( clOrdID, sessionID );

    if ( possResend == true )
    {
      if ( m_orderIDs.find( pair ) != m_orderIDs.end() )
        return ;
    }
    m_orderIDs.insert( pair );
    FIX::Session::sendToTarget( echo, sessionID );
  }